

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::integerCheck(TParseContext *this,TIntermTyped *node,char *token)

{
  bool bVar1;
  TBasicType from;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  TBasicType from_type;
  char *token_local;
  TIntermTyped *node_local;
  TParseContext *this_local;
  
  from = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
  if (((((from != EbtInt) && (from != EbtUint)) &&
       (bVar1 = TIntermediate::canImplicitlyPromote
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,from,
                           EbtInt,EOpNull), !bVar1)) &&
      (bVar1 = TIntermediate::canImplicitlyPromote
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,from,
                          EbtUint,EOpNull), !bVar1)) ||
     (uVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2c])(), (uVar2 & 1) == 0)) {
    iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,CONCAT44(extraout_var,iVar3),"scalar integer expression required",token,"");
  }
  return;
}

Assistant:

void TParseContext::integerCheck(const TIntermTyped* node, const char* token)
{
    auto from_type = node->getBasicType();
    if ((from_type == EbtInt || from_type == EbtUint ||
         intermediate.canImplicitlyPromote(from_type, EbtInt, EOpNull) ||
         intermediate.canImplicitlyPromote(from_type, EbtUint, EOpNull)) && node->isScalar())
        return;

    error(node->getLoc(), "scalar integer expression required", token, "");
}